

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

QVariant * __thiscall
QFileSystemModel::headerData(QFileSystemModel *this,int section,Orientation orientation,int role)

{
  QString *this_00;
  int in_ECX;
  uint in_EDX;
  Orientation in_ESI;
  QImage *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  QString returnValue;
  QImage pixmap;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  QImage *in_stack_ffffffffffffff20;
  QImage *pQVar1;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = in_RDI;
  if (in_R8D == 1) {
    if (in_EDX == 0) {
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QImage::QImage(in_RDI,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                     (Format)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      QImage::fill(in_RDI,(GlobalColor)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      QImage::operator_cast_to_QVariant
                ((QImage *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      QImage::~QImage(in_stack_ffffffffffffff20);
      goto LAB_00aa6383;
    }
  }
  else if (in_R8D == 7) {
    ::QVariant::QVariant((QVariant *)in_RDI,1);
    pQVar1 = in_RDI;
    goto LAB_00aa6383;
  }
  if ((in_ECX != 1) || (in_R8D != 0)) {
    QAbstractItemModel::headerData((int)in_RDI,in_ESI,in_EDX);
    pQVar1 = in_RDI;
    goto LAB_00aa6383;
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0xaa6224);
  this_00 = (QString *)(ulong)in_EDX;
  switch(this_00) {
  case (QString *)0x0:
    tr((char *)in_RDI,(char *)this_00,in_stack_ffffffffffffff1c);
    QString::operator=(this_00,(QString *)
                               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QString::~QString((QString *)0xaa628c);
    break;
  case (QString *)0x1:
    tr((char *)in_RDI,(char *)this_00,in_stack_ffffffffffffff1c);
    QString::operator=(this_00,(QString *)
                               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QString::~QString((QString *)0xaa62d0);
    break;
  case (QString *)0x2:
    tr((char *)in_RDI,(char *)this_00,in_stack_ffffffffffffff1c);
    QString::operator=(this_00,(QString *)
                               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QString::~QString((QString *)0xaa630e);
    break;
  case (QString *)0x3:
    tr((char *)in_RDI,(char *)this_00,in_stack_ffffffffffffff1c);
    QString::operator=(this_00,(QString *)
                               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QString::~QString((QString *)0xaa6346);
    break;
  default:
    ::QVariant::QVariant((QVariant *)0xaa6352);
    goto LAB_00aa6376;
  }
  ::QVariant::QVariant((QVariant *)in_RDI,(QString *)&local_38);
LAB_00aa6376:
  QString::~QString((QString *)0xaa6383);
LAB_00aa6383:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QVariant *)pQVar1;
}

Assistant:

QVariant QFileSystemModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    switch (role) {
    case Qt::DecorationRole:
        if (section == 0) {
            // ### TODO oh man this is ugly and doesn't even work all the way!
            // it is still 2 pixels off
            QImage pixmap(16, 1, QImage::Format_ARGB32_Premultiplied);
            pixmap.fill(Qt::transparent);
            return pixmap;
        }
        break;
    case Qt::TextAlignmentRole:
        return Qt::AlignLeft;
    }

    if (orientation != Qt::Horizontal || role != Qt::DisplayRole)
        return QAbstractItemModel::headerData(section, orientation, role);

    QString returnValue;
    switch (section) {
    case QFileSystemModelPrivate::NameColumn:
        returnValue = tr("Name");
        break;
    case QFileSystemModelPrivate::SizeColumn:
        returnValue = tr("Size");
        break;
    case QFileSystemModelPrivate::TypeColumn:
        returnValue =
#ifdef Q_OS_MAC
                    tr("Kind", "Match OS X Finder");
#else
                    tr("Type", "All other platforms");
#endif
        break;
    // Windows   - Type
    // OS X      - Kind
    // Konqueror - File Type
    // Nautilus  - Type
    case QFileSystemModelPrivate::TimeColumn:
        returnValue = tr("Date Modified");
        break;
    default: return QVariant();
    }
    return returnValue;
}